

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitT(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *__src;
  float *__src_00;
  int iVar5;
  int iVar6;
  float *local_40;
  
  iVar1 = this->v;
  iVar2 = this->vw;
  iVar6 = (-1 << ((this->res).vlog2 & 0x1fU)) + iVar2 + iVar1;
  iVar3 = this->u;
  iVar4 = this->uw;
  __src = this->ku;
  __src_00 = this->kv;
  if (iVar6 < iVar2) {
    k->res = this->res;
    k->u = iVar3;
    k->v = 0;
    k->uw = iVar4;
    k->vw = iVar6;
    memcpy(k->kubuff,__src,(long)iVar4 << 2);
    memcpy(k->kvbuff,__src_00 + ((long)iVar2 - (long)iVar6),(long)iVar6 * 4);
    iVar6 = this->vw - iVar6;
    iVar5 = 0;
  }
  else {
    iVar5 = this->rot;
    k->res = this->res;
    k->u = iVar3;
    k->v = iVar1;
    k->uw = iVar4;
    k->vw = iVar2;
    memcpy(k->kubuff,__src,(long)iVar4 << 2);
    memcpy(k->kvbuff,__src_00,(long)iVar2 << 2);
    k->v = (-1 << ((this->res).vlog2 & 0x1fU)) + iVar1;
    this->v = 0;
    iVar6 = 0;
  }
  local_40 = k->kvbuff;
  k->ku = k->kubuff;
  k->kv = local_40;
  k->rot = iVar5;
  this->vw = iVar6;
  return;
}

Assistant:

void splitT(PtexSeparableKernel& k)
    {
        // split off top piece of width w into k
        int w = v + vw - res.v();
        if (w < vw) {
            // normal case - split off a portion
            //    res  u  v  uw vw  ku  kv
            k.set(res, u, 0, uw, w, ku, kv + vw - w);

            // update local
            vw -= w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.v -= res.v();
            v = 0; vw = 0;
        }
    }